

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgconvert.cpp
# Opt level: O0

uint8_t __thiscall BitDecoder<4UL>::decode(BitDecoder<4UL> *this)

{
  byte bVar1;
  size_t sVar2;
  uint8_t value;
  BitDecoder<4UL> *this_local;
  
  bVar1 = *this->_read;
  sVar2 = this->_shift;
  this->_shift = this->_shift + 4;
  if (7 < this->_shift) {
    this->_read = this->_read + 1;
    this->_shift = 0;
  }
  return (byte)((int)(uint)bVar1 >> ((byte)sVar2 & 0x1f)) & 0xf;
}

Assistant:

uint8_t decode() {
        uint8_t value = (*_read >> _shift) & Mask;
        _shift += Size;
        if (_shift >= 8) {
            ++_read;
            _shift = 0;
        }
        return value;
    }